

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O3

int mriStep_UpdateF0(ARKodeMem ark_mem,ARKodeMRIStepMem step_mem,sunrealtype t,N_Vector y,int mode)

{
  int iVar1;
  int nvec;
  int local_2c;
  
  if (mode == 1) {
    if (ark_mem->fn_is_current != 0) {
      return 0;
    }
    if (step_mem->explicit_rhs != 0) {
      iVar1 = (*step_mem->fse)(t,y,*step_mem->Fse,ark_mem->user_data);
      step_mem->nfse = step_mem->nfse + 1;
      if (iVar1 != 0) {
        iVar1 = 0x675;
        goto LAB_00158792;
      }
      step_mem->fse_is_current = 1;
      if (step_mem->expforcing != 0) {
        *step_mem->cvals = 1.0;
        *step_mem->Xvecs = *step_mem->Fse;
        local_2c = 1;
        mriStep_ApplyForcing(step_mem,t,1.0,&local_2c);
        N_VLinearCombination(local_2c,step_mem->cvals,step_mem->Xvecs,*step_mem->Fse);
      }
    }
    if (step_mem->implicit_rhs == 0) {
      return 0;
    }
    iVar1 = (*step_mem->fsi)(t,y,*step_mem->Fsi,ark_mem->user_data);
    step_mem->nfsi = step_mem->nfsi + 1;
    if (iVar1 == 0) goto LAB_001587ae;
    iVar1 = 0x68e;
  }
  else {
    if (mode != 0) {
      arkProcessError(ark_mem,-8,0x6a5,"mriStep_UpdateF0",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                      ,"Unknown full RHS mode");
      return -8;
    }
    if ((step_mem->explicit_rhs != 0) &&
       ((step_mem->fse_is_current == 0 || (ark_mem->fn_is_current == 0)))) {
      iVar1 = (*step_mem->fse)(t,y,*step_mem->Fse,ark_mem->user_data);
      step_mem->nfse = step_mem->nfse + 1;
      if (iVar1 != 0) {
        iVar1 = 0x637;
        goto LAB_00158792;
      }
      step_mem->fse_is_current = 1;
      if (step_mem->expforcing != 0) {
        *step_mem->cvals = 1.0;
        *step_mem->Xvecs = *step_mem->Fse;
        local_2c = 1;
        mriStep_ApplyForcing(step_mem,t,1.0,&local_2c);
        N_VLinearCombination(local_2c,step_mem->cvals,step_mem->Xvecs,*step_mem->Fse);
      }
    }
    if (step_mem->implicit_rhs == 0) {
      return 0;
    }
    if ((step_mem->fsi_is_current != 0) && (ark_mem->fn_is_current != 0)) {
      return 0;
    }
    iVar1 = (*step_mem->fsi)(t,y,*step_mem->Fsi,ark_mem->user_data);
    step_mem->nfsi = step_mem->nfsi + 1;
    if (iVar1 == 0) {
LAB_001587ae:
      step_mem->fsi_is_current = 1;
      if (step_mem->impforcing == 0) {
        return 0;
      }
      *step_mem->cvals = 1.0;
      *step_mem->Xvecs = *step_mem->Fsi;
      local_2c = 1;
      mriStep_ApplyForcing(step_mem,t,1.0,&local_2c);
      N_VLinearCombination(local_2c,step_mem->cvals,step_mem->Xvecs,*step_mem->Fsi);
      return 0;
    }
    iVar1 = 0x654;
  }
LAB_00158792:
  arkProcessError(ark_mem,-8,iVar1,"mriStep_UpdateF0",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                  ,"At t = %.15g, the right-hand side routine failed in an unrecoverable manner.",t)
  ;
  return -8;
}

Assistant:

int mriStep_UpdateF0(ARKodeMem ark_mem, ARKodeMRIStepMem step_mem,
                     sunrealtype t, N_Vector y, int mode)
{
  int nvec, retval;

  /* perform RHS functions contingent on 'mode' argument */
  switch (mode)
  {
  case ARK_FULLRHS_START:

    /* update the RHS components */

    /*   explicit component */
    if (step_mem->explicit_rhs)
    {
      /* if either ARKODE or MRIStep consider Fse[0] stale, then recompute */
      if (!step_mem->fse_is_current || !ark_mem->fn_is_current)
      {
        retval = step_mem->fse(t, y, step_mem->Fse[0], ark_mem->user_data);
        step_mem->nfse++;
        if (retval != 0)
        {
          arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__,
                          __FILE__, MSG_ARK_RHSFUNC_FAILED, t);
          return (ARK_RHSFUNC_FAIL);
        }
        step_mem->fse_is_current = SUNTRUE;

        /* Add external forcing, if applicable */
        if (step_mem->expforcing)
        {
          step_mem->cvals[0] = ONE;
          step_mem->Xvecs[0] = step_mem->Fse[0];
          nvec               = 1;
          mriStep_ApplyForcing(step_mem, t, ONE, &nvec);
          N_VLinearCombination(nvec, step_mem->cvals, step_mem->Xvecs,
                               step_mem->Fse[0]);
        }
      }
    }

    /*   implicit component */
    if (step_mem->implicit_rhs)
    {
      /* if either ARKODE or MRIStep consider Fsi[0] stale, then recompute */
      if (!step_mem->fsi_is_current || !ark_mem->fn_is_current)
      {
        retval = step_mem->fsi(t, y, step_mem->Fsi[0], ark_mem->user_data);
        step_mem->nfsi++;
        if (retval != 0)
        {
          arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__,
                          __FILE__, MSG_ARK_RHSFUNC_FAILED, t);
          return (ARK_RHSFUNC_FAIL);
        }
        step_mem->fsi_is_current = SUNTRUE;

        /* Add external forcing, if applicable */
        if (step_mem->impforcing)
        {
          step_mem->cvals[0] = ONE;
          step_mem->Xvecs[0] = step_mem->Fsi[0];
          nvec               = 1;
          mriStep_ApplyForcing(step_mem, t, ONE, &nvec);
          N_VLinearCombination(nvec, step_mem->cvals, step_mem->Xvecs,
                               step_mem->Fsi[0]);
        }
      }
    }

    break;

  case ARK_FULLRHS_END:

    /* compute the full RHS */
    if (!(ark_mem->fn_is_current))
    {
      /* compute the explicit component */
      if (step_mem->explicit_rhs)
      {
        retval = step_mem->fse(t, y, step_mem->Fse[0], ark_mem->user_data);
        step_mem->nfse++;
        if (retval != 0)
        {
          arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__,
                          __FILE__, MSG_ARK_RHSFUNC_FAILED, t);
          return (ARK_RHSFUNC_FAIL);
        }
        step_mem->fse_is_current = SUNTRUE;

        /* Add external forcing, as appropriate */
        if (step_mem->expforcing)
        {
          step_mem->cvals[0] = ONE;
          step_mem->Xvecs[0] = step_mem->Fse[0];
          nvec               = 1;
          mriStep_ApplyForcing(step_mem, t, ONE, &nvec);
          N_VLinearCombination(nvec, step_mem->cvals, step_mem->Xvecs,
                               step_mem->Fse[0]);
        }
      }

      /* compute the implicit component */
      if (step_mem->implicit_rhs)
      {
        retval = step_mem->fsi(t, y, step_mem->Fsi[0], ark_mem->user_data);
        step_mem->nfsi++;
        if (retval != 0)
        {
          arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__,
                          __FILE__, MSG_ARK_RHSFUNC_FAILED, t);
          return (ARK_RHSFUNC_FAIL);
        }
        step_mem->fsi_is_current = SUNTRUE;

        /* Add external forcing, as appropriate */
        if (step_mem->impforcing)
        {
          step_mem->cvals[0] = ONE;
          step_mem->Xvecs[0] = step_mem->Fsi[0];
          nvec               = 1;
          mriStep_ApplyForcing(step_mem, t, ONE, &nvec);
          N_VLinearCombination(nvec, step_mem->cvals, step_mem->Xvecs,
                               step_mem->Fsi[0]);
        }
      }
    }

    break;

  default:
    /* return with RHS failure if unknown mode is requested */
    arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                    "Unknown full RHS mode");
    return (ARK_RHSFUNC_FAIL);
  }

  return (ARK_SUCCESS);
}